

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charstr.cpp
# Opt level: O0

char * __thiscall
icu_63::CharString::getAppendBuffer
          (CharString *this,int32_t minCapacity,int32_t desiredCapacityHint,int32_t *resultCapacity,
          UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  char *pcVar4;
  int32_t appendCapacity;
  UErrorCode *errorCode_local;
  int32_t *resultCapacity_local;
  int32_t desiredCapacityHint_local;
  int32_t minCapacity_local;
  CharString *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    iVar2 = MaybeStackArray<char,_40>::getCapacity(&this->buffer);
    iVar3 = (iVar2 - this->len) + -1;
    if (iVar3 < minCapacity) {
      UVar1 = ensureCapacity(this,this->len + minCapacity + 1,this->len + desiredCapacityHint + 1,
                             errorCode);
      if (UVar1 == '\0') {
        *resultCapacity = 0;
        this_local = (CharString *)0x0;
      }
      else {
        iVar2 = MaybeStackArray<char,_40>::getCapacity(&this->buffer);
        *resultCapacity = (iVar2 - this->len) + -1;
        pcVar4 = MaybeStackArray<char,_40>::getAlias(&this->buffer);
        this_local = (CharString *)(pcVar4 + this->len);
      }
    }
    else {
      *resultCapacity = iVar3;
      pcVar4 = MaybeStackArray<char,_40>::getAlias(&this->buffer);
      this_local = (CharString *)(pcVar4 + this->len);
    }
  }
  else {
    *resultCapacity = 0;
    this_local = (CharString *)0x0;
  }
  return (char *)this_local;
}

Assistant:

char *CharString::getAppendBuffer(int32_t minCapacity,
                                  int32_t desiredCapacityHint,
                                  int32_t &resultCapacity,
                                  UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        resultCapacity=0;
        return NULL;
    }
    int32_t appendCapacity=buffer.getCapacity()-len-1;  // -1 for NUL
    if(appendCapacity>=minCapacity) {
        resultCapacity=appendCapacity;
        return buffer.getAlias()+len;
    }
    if(ensureCapacity(len+minCapacity+1, len+desiredCapacityHint+1, errorCode)) {
        resultCapacity=buffer.getCapacity()-len-1;
        return buffer.getAlias()+len;
    }
    resultCapacity=0;
    return NULL;
}